

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

void __thiscall
jsonnet::internal::Index::Index
          (Index *this,LocationRange *lr,Fodder *open_fodder,AST *target,Fodder *dot_fodder,
          bool is_slice,AST *index,Fodder *end_colon_fodder,AST *end,Fodder *step_colon_fodder,
          AST *step,Fodder *id_fodder)

{
  AST::AST(&this->super_AST,lr,AST_INDEX,open_fodder);
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__Index_0029b158;
  this->target = target;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->dotFodder,dot_fodder);
  this->isSlice = is_slice;
  this->index = index;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->endColonFodder,end_colon_fodder);
  this->end = end;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->stepColonFodder,step_colon_fodder);
  this->step = step;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->idFodder,id_fodder);
  this->id = (Identifier *)0x0;
  return;
}

Assistant:

Index(const LocationRange &lr, const Fodder &open_fodder, AST *target, const Fodder &dot_fodder,
          bool is_slice, AST *index, const Fodder &end_colon_fodder, AST *end,
          const Fodder &step_colon_fodder, AST *step, const Fodder &id_fodder)
        : AST(lr, AST_INDEX, open_fodder),
          target(target),
          dotFodder(dot_fodder),
          isSlice(is_slice),
          index(index),
          endColonFodder(end_colon_fodder),
          end(end),
          stepColonFodder(step_colon_fodder),
          step(step),
          idFodder(id_fodder),
          id(nullptr)
    {
    }